

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV3MeshWeightsBlock(Parser *this,Mesh *mesh)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint *iOut;
  uint iNumBones;
  uint iNumVertices;
  int local_3c;
  uint local_38;
  uint local_34;
  
  local_34 = 0;
  local_3c = 0;
  local_38 = 0;
  pbVar5 = (byte *)this->filePtr;
  do {
    bVar1 = *pbVar5;
    if (bVar1 == 0x2a) {
      do {
        pbVar4 = pbVar5 + 1;
        this->filePtr = (char *)pbVar4;
        iVar3 = strncmp("MESH_NUMVERTEX",(char *)pbVar4,0xe);
        if (iVar3 == 0) {
          bVar1 = pbVar5[0xf];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
          goto LAB_003f6d28;
          pbVar4 = pbVar5 + 0x10;
          if (bVar1 == 0) {
            pbVar4 = pbVar5 + 0xf;
          }
          this->filePtr = (char *)pbVar4;
          iOut = &local_34;
LAB_003f6e1d:
          ParseLV4MeshLong(this,iOut);
        }
        else {
LAB_003f6d28:
          iVar3 = strncmp("MESH_NUMBONE",(char *)pbVar4,0xc);
          if (iVar3 == 0) {
            bVar1 = pbVar5[0xd];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar4 = pbVar5 + 0xe;
              if (bVar1 == 0) {
                pbVar4 = pbVar5 + 0xd;
              }
              this->filePtr = (char *)pbVar4;
              iOut = &local_38;
              goto LAB_003f6e1d;
            }
          }
          iVar3 = strncmp("MESH_BONE_LIST",(char *)pbVar4,0xe);
          if (iVar3 == 0) {
            bVar1 = pbVar5[0xf];
            if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
              pbVar4 = pbVar5 + 0x10;
              if (bVar1 == 0) {
                pbVar4 = pbVar5 + 0xf;
              }
              this->filePtr = (char *)pbVar4;
              ParseLV4MeshBones(this,local_38,mesh);
              goto LAB_003f6e5c;
            }
          }
          iVar3 = strncmp("MESH_BONE_VERTEX_LIST",(char *)pbVar4,0x15);
          if (iVar3 != 0) break;
          bVar1 = pbVar5[0x16];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
          pbVar4 = pbVar5 + 0x17;
          if (bVar1 == 0) {
            pbVar4 = pbVar5 + 0x16;
          }
          this->filePtr = (char *)pbVar4;
          ParseLV4MeshBonesVertices(this,local_34,mesh);
        }
LAB_003f6e5c:
        pbVar5 = (byte *)this->filePtr;
        pbVar4 = pbVar5;
      } while (*pbVar5 == 0x2a);
      pbVar5 = pbVar4;
      bVar1 = *pbVar5;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003f6eb8;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_WEIGHTS chunk (Level 3)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        local_3c = local_3c + -1;
        if (local_3c == 0) {
          this->filePtr = (char *)(pbVar5 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_003f6eba;
        local_3c = local_3c + 1;
      }
LAB_003f6eb8:
      bVar2 = false;
    }
LAB_003f6eba:
    this->bLastWasEndLine = bVar2;
    pbVar5 = pbVar5 + 1;
    this->filePtr = (char *)pbVar5;
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshWeightsBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0, iNumBones = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of bone vertices ...
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of bones
            if (TokenMatch(filePtr,"MESH_NUMBONE" ,12))
            {
                ParseLV4MeshLong(iNumBones);
                continue;
            }
            // parse the list of bones
            if (TokenMatch(filePtr,"MESH_BONE_LIST" ,14))
            {
                ParseLV4MeshBones(iNumBones,mesh);
                continue;
            }
            // parse the list of bones vertices
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX_LIST" ,21) )
            {
                ParseLV4MeshBonesVertices(iNumVertices,mesh);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_WEIGHTS");
    }
    return;
}